

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsonpath_error.hpp
# Opt level: O2

string * __thiscall
jsoncons::jsonpath::jsonpath_error_category_impl::message_abi_cxx11_
          (string *__return_storage_ptr__,jsonpath_error_category_impl *this,int ev)

{
  char *__s;
  allocator<char> local_9;
  
  switch(ev) {
  case 1:
    __s = "Expected \'$\' or \'@\'";
    break;
  case 2:
    __s = "Expected \'[\' or \'.\'";
    break;
  case 3:
    __s = "Expected \'\'\' or digit";
    break;
  case 4:
    __s = "Expected \'$\' or function expression";
    break;
  case 5:
    __s = "Expected @";
    break;
  case 6:
    __s = "Expected )";
    break;
  case 7:
    __s = "Expected ]";
    break;
  case 8:
    __s = "Expected dot or left bracket separator";
    break;
  case 9:
    __s = "Invalid path filter, expected \'/\'";
    break;
  case 10:
    __s = "Expected slice start";
    break;
  case 0xb:
    __s = "Expected slice end";
    break;
  case 0xc:
    __s = "Expected slice step";
    break;
  case 0xd:
    __s = 
    "Expected index, single or double quoted name, expression, filter, absolute (\'$\') path or relative (\'@\') path"
    ;
    break;
  default:
    __s = "Unknown jsonpath parser error";
    break;
  case 0xf:
    __s = "Invalid function name";
    break;
  case 0x10:
    __s = "Invalid argument type";
    break;
  case 0x11:
    __s = "Incorrect number of arguments";
    break;
  case 0x12:
    __s = "Function name not found";
    break;
  case 0x13:
    __s = "Could not parse JSON expression in a JSONPath filter";
    break;
  case 0x14:
    __s = "Could not parse JSON expression passed to JSONPath function";
    break;
  case 0x15:
    __s = "Unidentified error";
    break;
  case 0x16:
    __s = "Unexpected EOF while parsing jsonpath expression";
    break;
  case 0x17:
    __s = "Expected \':\', \'.\', \'[\', \',\', or \']\'";
    break;
  case 0x18:
    __s = "Argument to unflatten must be an object";
    break;
  case 0x19:
    __s = "Flattened key is invalid";
    break;
  case 0x1a:
    __s = "Slice step cannot be zero";
    break;
  case 0x1b:
    __s = "Invalid number";
    break;
  case 0x1c:
    __s = "Illegal escaped character";
    break;
  case 0x1d:
    __s = "Invalid codepoint";
    break;
  case 0x1e:
    __s = "Unknown function";
    break;
  case 0x1f:
    __s = "Invalid type";
    break;
  case 0x20:
    __s = "Unbalanced parentheses";
    break;
  case 0x21:
    __s = "Syntax error";
    break;
  case 0x22:
    __s = "Expected comparator";
    break;
  case 0x23:
    __s = "Expected operator \'||\'";
    break;
  case 0x24:
    __s = "Expected operator \'&&\'";
    break;
  case 0x25:
    __s = "Expected comma or right parenthesis";
    break;
  case 0x26:
    __s = "Expected comma or right bracket";
    break;
  case 0x27:
    __s = "Expected unquoted string, or single or double quoted string, or index or \'*\'";
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)__return_storage_ptr__,__s,&local_9);
  return __return_storage_ptr__;
}

Assistant:

std::string message(int ev) const override
        {
            switch (static_cast<jsonpath_errc>(ev))
            {
                case jsonpath_errc::expected_root_or_current_node:
                    return "Expected '$' or '@'";
                case jsonpath_errc::expected_lbracket_or_dot:
                    return "Expected '[' or '.'";
                case jsonpath_errc::expected_single_quote_or_digit:
                    return "Expected '\'' or digit";
                case jsonpath_errc::expected_root_or_function:
                    return "Expected '$' or function expression";
                case jsonpath_errc::expected_current_node:
                    return "Expected @";
                case jsonpath_errc::expected_rbracket:
                    return "Expected ]";
                case jsonpath_errc::expected_rparen:
                    return "Expected )";
                case jsonpath_errc::expected_slice_start:
                    return "Expected slice start";
                case jsonpath_errc::expected_slice_end:
                    return "Expected slice end";
                case jsonpath_errc::expected_slice_step:
                    return "Expected slice step";
                case jsonpath_errc::expected_separator:
                    return "Expected dot or left bracket separator";
                case jsonpath_errc::expected_forward_slash:
                    return "Invalid path filter, expected '/'";
                case jsonpath_errc::expected_bracket_specifier_or_union:
                    return "Expected index, single or double quoted name, expression, filter, absolute ('$') path or relative ('@') path";
                case jsonpath_errc::invalid_function_name:
                    return "Invalid function name";
                case jsonpath_errc::invalid_argument:
                    return "Invalid argument type";
                case jsonpath_errc::invalid_arity:
                    return "Incorrect number of arguments";
                case jsonpath_errc::function_name_not_found:
                    return "Function name not found";
                case jsonpath_errc::parse_error_in_filter:
                    return "Could not parse JSON expression in a JSONPath filter";
                case jsonpath_errc::argument_parse_error:
                    return "Could not parse JSON expression passed to JSONPath function";
                case jsonpath_errc::unidentified_error:
                    return "Unidentified error";
                case jsonpath_errc::unexpected_eof:
                    return "Unexpected EOF while parsing jsonpath expression";
                case jsonpath_errc::expected_colon_dot_left_bracket_comma_or_rbracket:
                    return "Expected ':', '.', '[', ',', or ']'";
                case jsonpath_errc::argument_to_unflatten_invalid:
                    return "Argument to unflatten must be an object";
                case jsonpath_errc::invalid_flattened_key:
                    return "Flattened key is invalid";
                case jsonpath_errc::step_cannot_be_zero:
                    return "Slice step cannot be zero";
                case jsonpath_errc::invalid_number:
                    return "Invalid number";
                case jsonpath_errc::illegal_escaped_character:
                    return "Illegal escaped character";
                case jsonpath_errc::invalid_codepoint:
                    return "Invalid codepoint";
                case jsonpath_errc::unknown_function:
                    return "Unknown function";
                case jsonpath_errc::invalid_type:
                    return "Invalid type";
                case jsonpath_errc::unbalanced_parentheses:
                    return "Unbalanced parentheses";
                case jsonpath_errc::syntax_error:
                    return "Syntax error";
                case jsonpath_errc::expected_comparator:
                    return "Expected comparator";
                case jsonpath_errc::expected_or:
                    return "Expected operator '||'";
                case jsonpath_errc::expected_and:
                    return "Expected operator '&&'";
                case jsonpath_errc::expected_comma_or_rparen:
                    return "Expected comma or right parenthesis";
                case jsonpath_errc::expected_comma_or_rbracket:
                    return "Expected comma or right bracket";
                case jsonpath_errc::expected_relative_path:
                    return "Expected unquoted string, or single or double quoted string, or index or '*'";
                default:
                    return "Unknown jsonpath parser error";
            }
        }